

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

uint8 * __thiscall
google::protobuf::OneofDescriptorProto::InternalSerializeWithCachedSizesToArray
          (OneofDescriptorProto *this,bool deterministic,uint8 *target)

{
  string *psVar1;
  OneofOptions *this_00;
  void *pvVar2;
  bool bVar3;
  uint uVar4;
  uint8 *puVar5;
  uint uVar6;
  byte *pbVar7;
  
  uVar6 = (this->_has_bits_).has_bits_[0];
  if ((uVar6 & 1) != 0) {
    psVar1 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length,SERIALIZE,
               "google.protobuf.OneofDescriptorProto.name");
    psVar1 = (this->name_).ptr_;
    *target = '\n';
    target = io::CodedOutputStream::WriteStringWithSizeToArray(psVar1,target + 1);
  }
  if ((uVar6 & 2) != 0) {
    this_00 = this->options_;
    *target = '\x12';
    pbVar7 = target + 1;
    uVar6 = this_00->_cached_size_;
    uVar4 = uVar6;
    if (0x7f < uVar6) {
      do {
        *pbVar7 = (byte)uVar6 | 0x80;
        uVar4 = uVar6 >> 7;
        pbVar7 = pbVar7 + 1;
        bVar3 = 0x3fff < uVar6;
        uVar6 = uVar4;
      } while (bVar3);
    }
    *pbVar7 = (byte)uVar4;
    target = OneofOptions::InternalSerializeWithCachedSizesToArray(this_00,deterministic,pbVar7 + 1)
    ;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    puVar5 = internal::WireFormat::SerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe),target);
    return puVar5;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* OneofDescriptorProto::InternalSerializeWithCachedSizesToArray(
    bool deterministic, ::google::protobuf::uint8* target) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.OneofDescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.OneofDescriptorProto.name");
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // optional .google.protobuf.OneofOptions options = 2;
  if (cached_has_bits & 0x00000002u) {
    target = ::google::protobuf::internal::WireFormatLite::
      InternalWriteMessageNoVirtualToArray(
        2, *this->options_, deterministic, target);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.OneofDescriptorProto)
  return target;
}